

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrDumpModuleBlif(FILE *pFile,Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  long lVar2;
  
  if (0 < vNtk->nSize) {
    fprintf((FILE *)pFile,".model %s\n",*vNtk->pArray);
    fwrite(".inputs",7,1,(FILE *)pFile);
    if (1 < vNtk->nSize) {
      pvVar1 = vNtk->pArray[1];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar2 = 0;
        do {
          fprintf((FILE *)pFile," %s",*(undefined8 *)(*(long *)((long)pvVar1 + 8) + lVar2 * 8));
          lVar2 = lVar2 + 1;
        } while (lVar2 < *(int *)((long)pvVar1 + 4));
      }
      fputc(10,(FILE *)pFile);
      fwrite(".outputs",8,1,(FILE *)pFile);
      if (2 < vNtk->nSize) {
        pvVar1 = vNtk->pArray[2];
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar2 = 0;
          do {
            fprintf((FILE *)pFile," %s",*(undefined8 *)(*(long *)((long)pvVar1 + 8) + lVar2 * 8));
            lVar2 = lVar2 + 1;
          } while (lVar2 < *(int *)((long)pvVar1 + 4));
        }
        fputc(10,(FILE *)pFile);
        if (3 < vNtk->nSize) {
          if (*(int *)((long)vNtk->pArray[3] + 4) != 0) {
            __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                          ,0xbc,"void Bac_PtrDumpModuleBlif(FILE *, Vec_Ptr_t *)");
          }
          if (vNtk->nSize != 4) {
            pvVar1 = vNtk->pArray[4];
            if (0 < *(int *)((long)pvVar1 + 4)) {
              lVar2 = 0;
              do {
                Bac_PtrDumpBoxBlif(pFile,*(Vec_Ptr_t **)(*(long *)((long)pvVar1 + 8) + lVar2 * 8));
                lVar2 = lVar2 + 1;
              } while (lVar2 < *(int *)((long)pvVar1 + 4));
            }
            fwrite(".end\n\n",6,1,(FILE *)pFile);
            return;
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrDumpModuleBlif( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, ".model %s\n", (char *)Vec_PtrEntry(vNtk, 0) );
    fprintf( pFile, ".inputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 1 );
    fprintf( pFile, "\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, ".end\n\n" );
}